

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O0

void dump_regressor(vw *all,string *reg_name,bool as_text)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  string *pmessage;
  ostream *poVar4;
  undefined8 uVar5;
  byte in_DL;
  vw_exception *in_RSI;
  stringstream __msg;
  io_buf io_temp;
  string start_name;
  io_buf *in_stack_fffffffffffffcd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  allocator *paVar6;
  int plineNumber;
  undefined7 in_stack_fffffffffffffcf8;
  io_buf *buf;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  stringstream local_2c8 [16];
  ostream local_2b8 [2];
  allocator local_91;
  string local_90 [32];
  string local_70 [32];
  int in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  char *in_stack_ffffffffffffffb8;
  io_buf *in_stack_ffffffffffffffc0;
  byte local_11;
  
  local_11 = in_DL & 1;
  buf = (io_buf *)&stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,"",(allocator *)buf);
  bVar1 = std::operator==(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  if ((bVar1 & 1) == 0) {
    paVar6 = &local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,".writing",paVar6);
    plineNumber = (int)((ulong)paVar6 >> 0x20);
    std::operator+(in_stack_fffffffffffffcd8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcd0);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    io_buf::io_buf((io_buf *)0x35ad29);
    std::__cxx11::string::c_str();
    io_buf::open_file(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                      (bool)in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0);
    dump_regressor((vw *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),buf,
                   SUB81((ulong)in_RSI >> 0x38,0));
    pcVar3 = (char *)std::__cxx11::string::c_str();
    remove(pcVar3);
    pmessage = (string *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = rename((char *)pmessage,pcVar3);
    if (iVar2 != 0) {
      std::__cxx11::stringstream::stringstream(local_2c8);
      poVar4 = std::operator<<(local_2b8,
                               "WARN: dump_regressor(vw& all, string reg_name, bool as_text): cannot rename: "
                              );
      pcVar3 = (char *)std::__cxx11::string::c_str();
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4," to ");
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::operator<<(poVar4,pcVar3);
      uVar5 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_RSI,(char *)CONCAT17(bVar1,in_stack_fffffffffffffcf8),plineNumber,pmessage);
      __cxa_throw(uVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    io_buf::~io_buf(in_stack_fffffffffffffcd0);
    std::__cxx11::string::~string(local_70);
  }
  return;
}

Assistant:

void dump_regressor(vw& all, string reg_name, bool as_text)
{
  if (reg_name == string(""))
    return;
  string start_name = reg_name + string(".writing");
  io_buf io_temp;

  io_temp.open_file(start_name.c_str(), all.stdin_off, io_buf::WRITE);

  dump_regressor(all, io_temp, as_text);

  remove(reg_name.c_str());

  if (0 != rename(start_name.c_str(), reg_name.c_str()))
    THROW("WARN: dump_regressor(vw& all, string reg_name, bool as_text): cannot rename: "
        << start_name.c_str() << " to " << reg_name.c_str());
}